

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Int.cpp
# Opt level: O3

uint32_t IntToHex_GetLength(int64_t a)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  uint64_t b;
  
  iVar2 = 0;
  uVar1 = a;
  do {
    uVar3 = uVar1;
    iVar2 = iVar2 + 1;
    uVar1 = uVar3 >> 4;
  } while (0xf < uVar3);
  return (uint)(uVar3 < 8 && a < 0) + iVar2;
}

Assistant:

uint32_t IntToHex_GetLength (int64_t a)
{
    // If negative and first digit is <8, add one to induce leading 8-F
    // so that sign extension of most significant bit will work.
    // This might be a bad idea. TODO.
    uint64_t b = (uint64_t)a;
    uint32_t len = 0;
    uint64_t most_significant;
    do ++len;
    while ((most_significant = b), b >>= 4);
    return len + (a < 0 && most_significant < 8);
}